

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffbfeof(fitsfile *fptr,int *status)

{
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  for (ii = 0; ii < 0x28; ii = ii + 1) {
    if (fptr->Fptr->filesize <= fptr->Fptr->bufrecnum[ii] * 0xb40) {
      fptr->Fptr->bufrecnum[ii] = -1;
    }
  }
  return *status;
}

Assistant:

int ffbfeof(fitsfile *fptr,        /* I - FITS file pointer           */
           int *status)           /* IO - error status               */
{
/*
  clear any buffers beyond the end of file
*/
    int ii;

    for (ii = 0; ii < NIOBUF; ii++)
    {
        if ( (LONGLONG) (fptr->Fptr)->bufrecnum[ii] * IOBUFLEN >= fptr->Fptr->filesize)
        {
            (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
        }
    }

    return(*status);
}